

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

DistributionMapping __thiscall
amrex::DistributionMapping::makeKnapSack
          (DistributionMapping *this,Vector<double,_std::allocator<double>_> *rcost,int nmax)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar5;
  ulong uVar6;
  DistributionMapping DVar7;
  Real eff;
  Vector<long,_std::allocator<long>_> cost;
  
  std::make_shared<amrex::DistributionMapping::Ref>();
  std::vector<long,_std::allocator<long>_>::vector
            (&cost.super_vector<long,_std::allocator<long>_>,
             (long)(rcost->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(rcost->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&eff);
  _Var4 = std::
          __max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((rcost->super_vector<double,_std::allocator<double>_>).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  dVar1 = *_Var4._M_current;
  uVar6 = -(ulong)(dVar1 == 0.0);
  pdVar2 = (rcost->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (rcost->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (lVar5 = 0; lVar5 < (long)pdVar3 - (long)pdVar2 >> 3; lVar5 = lVar5 + 1) {
    cost.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar5] =
         (long)(pdVar2[lVar5] *
               (double)(uVar6 & 0x41cdcd6500000000 | ~uVar6 & (ulong)(1000000000.0 / dVar1))) + 1;
  }
  KnapSackProcessorMap
            (this,&cost.super_vector<long,_std::allocator<long>_>,*(int *)(DAT_006e0650 + -0x38),
             &eff,true,nmax,true);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&cost);
  DVar7.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar7.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (DistributionMapping)
         DVar7.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeKnapSack (const Vector<Real>& rcost, int nmax)
{
    BL_PROFILE("makeKnapSack");

    DistributionMapping r;

    Vector<Long> cost(rcost.size());

    Real wmax = *std::max_element(rcost.begin(), rcost.end());
    Real scale = (wmax == 0) ? 1.e9_rt : 1.e9_rt/wmax;

    for (int i = 0; i < rcost.size(); ++i) {
        cost[i] = Long(rcost[i]*scale) + 1L;
    }

    int nprocs = ParallelContext::NProcsSub();
    Real eff;

    r.KnapSackProcessorMap(cost, nprocs, &eff, true, nmax);

    return r;
}